

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O1

void __thiscall
wasm::LazyLocalGraph::LazyLocalGraph
          (LazyLocalGraph *this,Function *func,Module *module,
          optional<wasm::Expression::Id> queryClass)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_LocalGraphBase).func = func;
  (this->super_LocalGraphBase).module = module;
  p_Var1 = &(this->super_LocalGraphBase).SSAIndexes._M_t._M_impl.super__Rb_tree_header;
  (this->super_LocalGraphBase).SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_LocalGraphBase).SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_LocalGraphBase).SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_LocalGraphBase).SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_LocalGraphBase).SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->queryClass).super__Optional_base<wasm::Expression::Id,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Expression::Id> =
       (_Optional_payload_base<wasm::Expression::Id>)
       queryClass.super__Optional_base<wasm::Expression::Id,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Expression::Id>;
  (this->getSetsMap)._M_h._M_buckets = &(this->getSetsMap)._M_h._M_single_bucket;
  (this->getSetsMap)._M_h._M_bucket_count = 1;
  (this->getSetsMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->getSetsMap)._M_h._M_element_count = 0;
  (this->getSetsMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->getSetsMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->getSetsMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->setInfluences)._M_h._M_buckets = &(this->setInfluences)._M_h._M_single_bucket;
  (this->setInfluences)._M_h._M_bucket_count = 1;
  (this->setInfluences)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->setInfluences)._M_h._M_element_count = 0;
  (this->setInfluences)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->setInfluences)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->setInfluences)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->getInfluences).
  super__Optional_base<std::unordered_map<wasm::LocalGet_*,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::unordered_map<wasm::LocalGet_*,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::unordered_map<wasm::LocalGet_*,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>_>
  ._M_engaged = false;
  (this->SSAIndexes)._M_h._M_buckets = &(this->SSAIndexes)._M_h._M_single_bucket;
  (this->SSAIndexes)._M_h._M_bucket_count = 1;
  (this->SSAIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->SSAIndexes)._M_h._M_element_count = 0;
  (this->SSAIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->SSAIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->SSAIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->locations).
  super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
  ._M_engaged = false;
  (this->flower)._M_t.
  super___uniq_ptr_impl<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>._M_t.
  super__Tuple_impl<0UL,_wasm::LocalGraphFlower_*,_std::default_delete<wasm::LocalGraphFlower>_>.
  super__Head_base<0UL,_wasm::LocalGraphFlower_*,_false>._M_head_impl = (LocalGraphFlower *)0x0;
  return;
}

Assistant:

LazyLocalGraph::LazyLocalGraph(Function* func,
                               Module* module,
                               std::optional<Expression::Id> queryClass)
  : LocalGraphBase(func, module), queryClass(queryClass) {}